

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

void __thiscall
testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  UnitTestImpl *this_00;
  HasNewFatalFailureHelper *this_local;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00575340;
  this_00 = GetUnitTestImpl();
  UnitTestImpl::SetTestPartResultReporterForCurrentThread(this_00,this->original_reporter_);
  TestPartResultReporterInterface::~TestPartResultReporterInterface
            (&this->super_TestPartResultReporterInterface);
  return;
}

Assistant:

HasNewFatalFailureHelper::~HasNewFatalFailureHelper() {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(
      original_reporter_);
}